

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O2

CURLcode ftp_pl_insert_finfo(connectdata *conn,fileinfo *infop)

{
  Curl_easy *data;
  long *plVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  code *pcVar6;
  
  data = conn->data;
  plVar1 = (long *)(data->wildcard).protdata;
  lVar2 = *plVar1;
  pcVar4 = (infop->info).b_data;
  (infop->info).filename = pcVar4 + *(long *)(lVar2 + 0x28);
  pcVar5 = pcVar4 + *(long *)(lVar2 + 0x38);
  if (*(long *)(lVar2 + 0x38) == 0) {
    pcVar5 = (char *)0x0;
  }
  (infop->info).strings.group = pcVar5;
  pcVar5 = pcVar4 + *(long *)(lVar2 + 0x48);
  if (*(long *)(lVar2 + 0x48) == 0) {
    pcVar5 = (char *)0x0;
  }
  (infop->info).strings.perm = pcVar5;
  pcVar5 = pcVar4 + *(long *)(lVar2 + 0x50);
  if (*(long *)(lVar2 + 0x50) == 0) {
    pcVar5 = (char *)0x0;
  }
  (infop->info).strings.target = pcVar5;
  (infop->info).strings.time = pcVar4 + *(long *)(lVar2 + 0x40);
  pcVar4 = pcVar4 + *(long *)(lVar2 + 0x30);
  if (*(long *)(lVar2 + 0x30) == 0) {
    pcVar4 = (char *)0x0;
  }
  (infop->info).strings.user = pcVar4;
  pcVar6 = (data->set).fnmatch;
  if (pcVar6 == (curl_fnmatch_callback)0x0) {
    pcVar6 = Curl_fnmatch;
  }
  Curl_set_in_callback(data,true);
  iVar3 = (*pcVar6)((conn->data->set).fnmatch_data,(data->wildcard).pattern,(infop->info).filename);
  if (iVar3 == 0) {
    if (((infop->info).filetype == CURLFILETYPE_SYMLINK) &&
       (pcVar5 = (infop->info).strings.target, pcVar5 != (char *)0x0)) {
      pcVar5 = strstr(pcVar5," -> ");
      Curl_set_in_callback(conn->data,false);
      if (pcVar5 != (char *)0x0) goto LAB_0011fcc7;
    }
    else {
      Curl_set_in_callback(conn->data,false);
    }
    Curl_llist_insert_next
              (&(data->wildcard).filelist,(data->wildcard).filelist.tail,infop,&infop->list);
  }
  else {
    Curl_set_in_callback(conn->data,false);
LAB_0011fcc7:
    Curl_fileinfo_cleanup(infop);
  }
  lVar2 = *plVar1;
  *(undefined8 *)(lVar2 + 0x10) = 0;
  return (CURLcode)lVar2;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct connectdata *conn,
                                    struct fileinfo *infop)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = &conn->data->wildcard;
  struct ftp_wc *ftpwc = wc->protdata;
  struct Curl_llist *llist = &wc->filelist;
  struct ftp_parselist_data *parser = ftpwc->parser;
  bool add = TRUE;
  struct curl_fileinfo *finfo = &infop->info;

  /* move finfo pointers to b_data */
  char *str = finfo->b_data;
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = conn->data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  Curl_set_in_callback(conn->data, true);
  if(compare(conn->data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }
  Curl_set_in_callback(conn->data, false);

  if(add) {
    Curl_llist_insert_next(llist, llist->tail, finfo, &infop->list);
  }
  else {
    Curl_fileinfo_cleanup(infop);
  }

  ftpwc->parser->file_data = NULL;
  return CURLE_OK;
}